

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::LoadFlagsFromFile(string *path)

{
  bool bVar1;
  FILE *__stream;
  ostream *poVar2;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *file;
  long lVar3;
  size_t i;
  ulong uVar4;
  undefined1 local_58 [8];
  string contents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  
  __stream = fopen((path->_M_dataplus)._M_p,"r");
  file = extraout_RDX;
  if (__stream == (FILE *)0x0) {
    GTestLog::GTestLog((GTestLog *)local_58,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest.cc"
                       ,0x1a08);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to open file \"");
    poVar2 = std::operator<<(poVar2,(string *)FLAGS_gtest_flagfile_abi_cxx11_);
    std::operator<<(poVar2,"\"");
    GTestLog::~GTestLog((GTestLog *)local_58);
    file = extraout_RDX_00;
  }
  ReadEntireFile_abi_cxx11_((string *)local_58,(internal *)__stream,file);
  fclose(__stream);
  contents.field_2._8_8_ = 0;
  SplitString((string *)local_58,'\n',
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&contents.field_2 + 8));
  lVar3 = 8;
  for (uVar4 = 0; uVar4 < (ulong)((long)-contents.field_2._8_8_ >> 5); uVar4 = uVar4 + 1) {
    if (*(long *)(contents.field_2._8_8_ + lVar3) != 0) {
      bVar1 = ParseGoogleTestFlag(*(char **)(contents.field_2._8_8_ + -8 + lVar3));
      if (!bVar1) {
        g_help_flag = 1;
      }
    }
    lVar3 = lVar3 + 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&contents.field_2 + 8));
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

static void LoadFlagsFromFile(const std::string& path) {
  FILE* flagfile = posix::FOpen(path.c_str(), "r");
  if (!flagfile) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << GTEST_FLAG_GET(flagfile)
                      << "\"";
  }
  std::string contents(ReadEntireFile(flagfile));
  posix::FClose(flagfile);
  std::vector<std::string> lines;
  SplitString(contents, '\n', &lines);
  for (size_t i = 0; i < lines.size(); ++i) {
    if (lines[i].empty()) continue;
    if (!ParseGoogleTestFlag(lines[i].c_str())) g_help_flag = true;
  }
}